

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O2

Bigint * diff(Bigint *a,Bigint *b)

{
  int iVar1;
  ULong UVar2;
  uint uVar3;
  Bigint *pBVar4;
  int iVar5;
  ULong *pUVar6;
  Bigint *pBVar7;
  ULong *pUVar8;
  ulong uVar9;
  long lVar10;
  ULong *pUVar11;
  
  uVar3 = cmp(a,b);
  if (uVar3 == 0) {
    pBVar4 = Balloc(0);
    pBVar4->wds = 1;
    pBVar4->x[0] = 0;
  }
  else {
    pBVar7 = a;
    if ((int)uVar3 < 0) {
      pBVar7 = b;
      b = a;
    }
    pBVar4 = Balloc(pBVar7->k);
    pBVar4->sign = uVar3 >> 0x1f;
    iVar5 = pBVar7->wds;
    iVar1 = b->wds;
    pUVar11 = b->x;
    pUVar6 = (ULong *)&pBVar4->wds;
    uVar9 = 0;
    pUVar8 = pBVar7->x;
    do {
      lVar10 = (ulong)*pUVar8 - (*pUVar11 + uVar9);
      pUVar6[1] = (ULong)lVar10;
      pUVar6 = pUVar6 + 1;
      pUVar8 = pUVar8 + 1;
      pUVar11 = pUVar11 + 1;
      uVar9 = (ulong)((uint)((ulong)lVar10 >> 0x20) & 1);
    } while (pUVar11 < b->x + iVar1);
    for (; pUVar8 < pBVar7->x + iVar5; pUVar8 = pUVar8 + 1) {
      lVar10 = *pUVar8 - uVar9;
      uVar9 = (ulong)((uint)((ulong)lVar10 >> 0x20) & 1);
      pUVar6[1] = (int)lVar10;
      pUVar6 = pUVar6 + 1;
    }
    iVar5 = iVar5 + 1;
    do {
      iVar5 = iVar5 + -1;
      UVar2 = *pUVar6;
      pUVar6 = pUVar6 + -1;
    } while (UVar2 == 0);
    pBVar4->wds = iVar5;
  }
  return pBVar4;
}

Assistant:

static Bigint *
diff(Bigint *a, Bigint *b MTd)
{
	Bigint *c;
	int i, wa, wb;
	ULong *xa, *xae, *xb, *xbe, *xc;
#ifdef ULLong
	ULLong borrow, y;
#else
	ULong borrow, y;
#ifdef Pack_32
	ULong z;
#endif
#endif

	i = cmp(a,b);
	if (!i) {
		c = Balloc(0 MTa);
		c->wds = 1;
		c->x[0] = 0;
		return c;
		}
	if (i < 0) {
		c = a;
		a = b;
		b = c;
		i = 1;
		}
	else
		i = 0;
	c = Balloc(a->k MTa);
	c->sign = i;
	wa = a->wds;
	xa = a->x;
	xae = xa + wa;
	wb = b->wds;
	xb = b->x;
	xbe = xb + wb;
	xc = c->x;
	borrow = 0;
#ifdef ULLong
	do {
		y = (ULLong)*xa++ - *xb++ - borrow;
		borrow = y >> 32 & (ULong)1;
		*xc++ = y & FFFFFFFF;
		}
		while(xb < xbe);
	while(xa < xae) {
		y = *xa++ - borrow;
		borrow = y >> 32 & (ULong)1;
		*xc++ = y & FFFFFFFF;
		}
#else
#ifdef Pack_32
	do {
		y = (*xa & 0xffff) - (*xb & 0xffff) - borrow;
		borrow = (y & 0x10000) >> 16;
		z = (*xa++ >> 16) - (*xb++ >> 16) - borrow;
		borrow = (z & 0x10000) >> 16;
		Storeinc(xc, z, y);
		}
		while(xb < xbe);
	while(xa < xae) {
		y = (*xa & 0xffff) - borrow;
		borrow = (y & 0x10000) >> 16;
		z = (*xa++ >> 16) - borrow;
		borrow = (z & 0x10000) >> 16;
		Storeinc(xc, z, y);
		}
#else
	do {
		y = *xa++ - *xb++ - borrow;
		borrow = (y & 0x10000) >> 16;
		*xc++ = y & 0xffff;
		}
		while(xb < xbe);
	while(xa < xae) {
		y = *xa++ - borrow;
		borrow = (y & 0x10000) >> 16;
		*xc++ = y & 0xffff;
		}
#endif
#endif
	while(!*--xc)
		wa--;
	c->wds = wa;
	return c;
	}